

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::FullUncertainty
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  reference ppVar5;
  reference ppVar6;
  reference piVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  long lVar10;
  undefined4 in_register_0000000c;
  long *plVar11;
  undefined1 auVar12 [16];
  int in_stack_00000008;
  code *local_198;
  code *local_170;
  value_type_conflict2 local_148;
  int local_144;
  iterator iStack_140;
  int sidx;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  pair<const_outkey2,_OutLosses> x_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  value_type_conflict2 local_b8 [4];
  undefined8 uStack_a8;
  pair<const_outkey2,_OutLosses> x;
  _Self local_88;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
  std::
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
         *)&__range1);
  pvVar3 = std::
           vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           ::operator[](this->out_loss_,1);
  __end1 = std::
           map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
           ::begin(pvVar3);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
       ::end(pvVar3);
  while (bVar2 = std::operator!=(&__end1,&local_88), bVar2) {
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end1);
    x.first.sidx = (int)(ppVar6->second).max_out_loss;
    uStack_a8._0_4_ = (ppVar6->first).summary_id;
    uStack_a8._4_4_ = (ppVar6->first).period_no;
    x.first._0_8_ = *(undefined8 *)&(ppVar6->first).sidx;
    pmVar8 = std::
             map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                           *)&__range1,(key_type *)&uStack_a8);
    plVar11 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
    local_170 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      local_170 = *(code **)(*plVar11 + (GetOutLoss - 1));
    }
    local_b8[0] = (value_type_conflict2)(*local_170)(plVar11);
    std::vector<float,_std::allocator<float>_>::push_back(pmVar8,local_b8);
    std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end1);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,
             (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)&__range1,(double)((long)this->totalperiods_ * (long)this->samplesize_),
             items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
             (int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,in_stack_00000008,1);
  if (((this->ordFlag_ & 1U) == 0) &&
     (sVar4 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::size(&this->ensembletosidx_), sVar4 != 0)) {
    __end2 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::begin(&this->ensembletosidx_);
    ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::end(&this->ensembletosidx_);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&ensemble.second.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator*(&__end2);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3,ppVar5);
      std::
      map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::clear((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               *)&__range1);
      pvVar3 = std::
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               ::operator[](this->out_loss_,1);
      __end3 = std::
               map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
               ::begin(pvVar3);
      x_1.second = (OutLosses)
                   std::
                   map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                   ::end(pvVar3);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&x_1.second), bVar2) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end3);
        __range4._4_4_ = (ppVar6->first).summary_id;
        unique0x00012004 = (ppVar6->first).period_no;
        x_1.first._0_8_ = *(undefined8 *)&(ppVar6->first).sidx;
        x_1.first.sidx = (int)(ppVar6->second).max_out_loss;
        __end4 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&ensemble);
        iStack_140 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)&ensemble);
        while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffec0), bVar2) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          local_144 = *piVar7;
          if (x_1.first.summary_id == local_144) {
            pmVar8 = std::
                     map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                   *)&__range1,(key_type *)((long)&__range4 + 4));
            plVar11 = (long *)((long)&x_1.first.period_no + CONCAT44(in_register_0000000c,epcalc));
            local_198 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              local_198 = *(code **)(*plVar11 + (GetOutLoss - 1));
            }
            local_148 = (value_type_conflict2)(*local_198)(plVar11);
            std::vector<float,_std::allocator<float>_>::push_back(pmVar8,&local_148);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end3);
      }
      iVar1 = this->totalperiods_;
      sVar9 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&ensemble);
      lVar10 = (long)iVar1 * sVar9;
      auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = 0x45300000;
      WriteExceedanceProbabilityTable
                (this,fileIDs,
                 (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  *)&__range1,
                 (auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0),
                 items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,(int)__range3,
                 in_stack_00000008,1);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3);
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
      operator++(&__end2);
    }
  }
  std::
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void aggreports::FullUncertainty(const std::vector<int> &fileIDs,
				 OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				 const int epcalc, const int eptype,
				 const int eptype_tvar) {

  std::map<int, lossvec> items;

  for (auto x : (*out_loss_)[SAMPLES]) {
    items[x.first.summary_id].push_back((x.second.*GetOutLoss)());
  }

  WriteExceedanceProbabilityTable(fileIDs, items,
				  (long)totalperiods_ * samplesize_, epcalc,
				  eptype, eptype_tvar);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    items[x.first.summary_id].push_back((x.second.*GetOutLoss)());
	  }
	}
      }
      WriteExceedanceProbabilityTable(fileIDs, items,
	(long)totalperiods_ * ensemble.second.size(), epcalc, ensemble.first,
	eptype_tvar, 1);
    }
  }

}